

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  undefined8 *puVar3;
  LogMessage *pLVar4;
  long lVar5;
  LogMessage local_50 [63];
  LogFinisher local_11;
  
  iVar1 = this->current_size_;
  if ((long)iVar1 < 0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6e8);
    pLVar4 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_50,"CHECK failed: (n) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=(&local_11,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
  }
  else if (iVar1 != 0) {
    pRVar2 = this->rep_;
    lVar5 = 0;
    do {
      puVar3 = (undefined8 *)pRVar2->elements[lVar5];
      lVar5 = lVar5 + 1;
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    } while (iVar1 != lVar5);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}